

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O1

LispPTR gcscanstack(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  LispPTR *pLVar4;
  DLword *pDVar5;
  LispPTR *pLVar6;
  LispPTR *pLVar7;
  LispPTR *pLVar8;
  char *__format;
  LispPTR LVar9;
  long lVar10;
  LispPTR *pLVar11;
  LispPTR *pLVar12;
  LispPTR *pLVar13;
  ulong uVar14;
  LispPTR *pLVar15;
  char debugStr [100];
  char local_98 [104];
  
  lVar10 = (ulong)InterfacePage->stackbase + 0x10000;
  pLVar6 = (LispPTR *)((ulong)((uint)InterfacePage->endofstack * 2 + 0x20000) + (long)Lisp_world);
  if ((InterfacePage->stackbase & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",lVar10);
  }
  pLVar13 = (LispPTR *)((ulong)(uint)((int)lVar10 * 2) + (long)Lisp_world);
  if (((ulong)pLVar13 & 3) != 0) {
    sprintf(local_98,"Frame ptr (%p) not to word bound at start of gcscanstack.",pLVar13);
    error(local_98);
  }
LAB_00124cfa:
  do {
    while( true ) {
      pLVar8 = pLVar13;
      uVar1 = *(ushort *)((long)pLVar8 + 2) >> 0xd;
      if (uVar1 == 5) goto LAB_00124e22;
      if (uVar1 == 6) break;
      if (uVar1 != 7) {
        LVar9 = *pLVar8;
        do {
          if ((-1 < *(short *)((ulong)(LVar9 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2)) &&
             (*GcDisabled_word != 0x4c)) {
            rec_htfind(LVar9 & 0xfffffff,2);
          }
          LVar9 = pLVar8[1];
          pLVar8 = pLVar8 + 1;
        } while( true );
      }
      if (pLVar6 <= pLVar8) {
        return 0;
      }
      pLVar13 = (LispPTR *)((ulong)(ushort)*pLVar8 * 2 + (long)pLVar8);
      if (((ulong)pLVar13 & 3) != 0) {
        __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_GUARD; old frame = %p.";
        goto LAB_00125064;
      }
    }
    uVar2 = pLVar8[1];
    uVar14 = (ulong)uVar2;
    if ((-1 < *(short *)((ulong)(uVar2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar2,2);
    }
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar14);
    }
    pDVar5 = Lisp_world;
    uVar1 = Lisp_world[uVar14 + 6];
    if (0xff < uVar1) {
      lVar10 = 0;
      do {
        LVar9 = pLVar8[lVar10 + 5];
        if (((LVar9 < 0x10000000) &&
            (-1 < *(short *)((ulong)(LVar9 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar9,2);
        }
        lVar10 = lVar10 + 1;
      } while ((uint)(uVar1 >> 8) != (uint)lVar10);
    }
    pLVar13 = (LispPTR *)((ulong)((uint)*(ushort *)((long)pLVar8 + 10) * 2) + (long)Stackspace);
    pLVar7 = pLVar13;
    if ((*pLVar8 & 0x2000000) == 0) {
      pLVar11 = (LispPTR *)0x0;
    }
    else {
      uVar2 = pLVar8[3];
      if ((uVar2 & 0xffff0000) == 0x10000) {
        uVar3 = *(uint *)(pDVar5 + uVar14 + 4);
        if ((-1 < *(short *)((long)MDStypetbl + (ulong)(uVar3 >> 8 & 0xffffe) ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar3 & 0xfffffff,2);
        }
        pLVar7 = (LispPTR *)(Stackspace + (uVar2 & 0xffff));
        pLVar11 = pLVar7 + (ulong)*(ushort *)((long)pLVar7 + 0xe) + 4;
      }
      else {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (uVar2 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c))
        {
          rec_htfind(uVar2,2);
        }
        pLVar11 = (LispPTR *)0x0;
      }
    }
    pLVar15 = pLVar8 + (long)(short)pDVar5[uVar14 + 3] * 2 + 9;
    pLVar4 = pLVar15;
    if (((ulong)pLVar15 & 3) != 0) {
      sprintf(local_98,
              "Frame ptr (%p) not to word bound in gcscanstack() STK_FX case; old frame = %p.",
              pLVar15,pLVar8);
      error(local_98);
    }
    while( true ) {
      for (; pLVar12 = pLVar11, pLVar8 = pLVar15, pLVar4 < pLVar7; pLVar4 = pLVar4 + 1) {
        LVar9 = *pLVar8;
        if (((LVar9 < 0x10000000) &&
            (-1 < *(short *)((ulong)(LVar9 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar9,2);
        }
        pLVar15 = pLVar8 + 1;
        pLVar11 = pLVar12;
      }
      if (pLVar12 == (LispPTR *)0x0) break;
      pLVar15 = pLVar12;
      pLVar4 = pLVar12;
      pLVar11 = (LispPTR *)0x0;
      pLVar7 = pLVar13;
      if (((ulong)pLVar12 & 3) != 0) {
        sprintf(local_98,
                "Frame ptr (%p) not to word bound in gcscanstack() scantemps; old frame = %p.",
                pLVar12,pLVar8);
        error(local_98);
        pLVar11 = (LispPTR *)0x0;
      }
    }
  } while (((ulong)pLVar13 & 3) == 0);
  __format = "Frame ptr (%p) not to word bound in gcscanstack(), end scantemps; old frame = %p.";
  goto LAB_00125064;
LAB_00124e22:
  pLVar13 = (LispPTR *)((ulong)(ushort)*pLVar8 * 2 + (long)pLVar8);
  if (((ulong)pLVar13 & 3) == 0) goto LAB_00124cfa;
  __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_FSB; old frame = %p.";
LAB_00125064:
  sprintf(local_98,__format,pLVar13,pLVar8);
  error(local_98);
  goto LAB_00124cfa;
}

Assistant:

LispPTR gcscanstack(void) {
  Bframe *basicframe;
  Bframe *obasicframe;
  LispPTR scanptr, scanend;
  UNSIGNED scanend68K;
  int ftyp;

  scanptr = VAG2(STK_HI, InterfacePage->stackbase);
  scanend = VAG2(STK_HI, InterfacePage->endofstack);
  scanend68K = (UNSIGNED)NativeAligned2FromLAddr(scanend);
  basicframe = (Bframe *)NativeAligned4FromLAddr(scanptr);

  if (0 != (3 & (UNSIGNED)basicframe)) {
    char debugStr[100];
    sprintf(debugStr,
            "Frame ptr (%p) not to word bound at start of gcscanstack.",
            (void *)basicframe);
    error(debugStr);
  }

  while (1) {
    /*This is endless loop until encountering tail of stack */

    ftyp = (int)basicframe->flags;
    switch (ftyp) {
      case STK_FX: {
        {
          struct frameex1 *frameex;
          struct fnhead *fnheader;
          frameex = (struct frameex1 *)basicframe;
          {
            LispPTR fn_head;
#ifdef BIGVM
            fn_head = (LispPTR)(frameex->fnheader);
#else
            fn_head = (LispPTR)VAG2(frameex->hi2fnheader, frameex->lofnheader);
#endif /* BIGVM */
            Stkref(fn_head);
            fnheader = (struct fnhead *)NativeAligned4FromLAddr(fn_head);
          }
          {
            int pcou;
            LispPTR *pvars;
            pvars = (LispPTR *)((DLword *)basicframe + FRAMESIZE);
            for (pcou = fnheader->nlocals; pcou-- != 0;) {
              LispPTR value;
              value = *pvars;
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              ++pvars;
            } /* for */
          }   /* int pcou */

          {
            UNSIGNED qtemp;
            UNSIGNED next;
            UNSIGNED ntend;

            next = qtemp = (UNSIGNED)NativeAligned2FromStackOffset(frameex->nextblock);
            /* this is offset */
            ntend = 0; /* init flag */
            if (frameex->validnametable) {
              LispPTR nametable;
#ifdef BIGVM
              nametable = frameex->nametable;
#define hi2nametable (nametable >> 16)
#else
              unsigned int hi2nametable;
              unsigned int lonametable;
              lonametable = frameex->lonametable;
              hi2nametable = frameex->hi2nametable;
              nametable = VAG2(hi2nametable, lonametable);
#endif /* BIGVM */
              if (STK_HI == hi2nametable) {
                Stkref(fnheader->framename);
#ifdef BIGVM
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(nametable & 0xFFFF);
#else
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(lonametable);
#endif
                ntend = (UNSIGNED)(((DLword *)qtemp) + FNHEADSIZE +
                                   (((struct fnhead *)qtemp)->ntsize) * 2);
              } else
                Stkref(nametable);
            } /* frameex->validnametable */

            obasicframe = basicframe;
            basicframe =
                (Bframe *)ADD_OFFSET(basicframe, FRAMESIZE + PADDING + (((fnheader->pv) + 1) << 2));

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack() STK_FX case; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          scantemps:
            while ((UNSIGNED)basicframe < (UNSIGNED)qtemp) {
              LispPTR value;
              value = *((LispPTR *)basicframe);
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              basicframe++;
            } /* while */

            if (ntend != 0) {
              obasicframe = basicframe;
              basicframe = (Bframe *)ntend;
              if (0 != (3 & (UNSIGNED)basicframe)) {
                char debugStr[100];
                sprintf(debugStr,
                        "Frame ptr (%p) not to word bound "
                        "in gcscanstack() scantemps; old frame = %p.",
                        (void *)basicframe, (void *)obasicframe);
                error(debugStr);
              }

              qtemp = next;
              ntend = 0;
              goto scantemps;
            }

            obasicframe = basicframe;
            basicframe = (Bframe *)next;

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack(), end scantemps; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          } /* LOCAL regs qtemp next */
        }   /* local regs fnheader frameex */
        break;
      }
      case STK_GUARD: /* stack's tail ? */ {
        if ((UNSIGNED)basicframe >= (UNSIGNED)scanend68K)
          return (NIL);
        else {
          obasicframe = basicframe;
          basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

          if (0 != (3 & (UNSIGNED)basicframe)) {
            char debugStr[100];
            sprintf(debugStr,
                    "Frame ptr (%p) not to word bound "
                    "in gcscanstack() STK_GUARD; old frame = %p.",
                    (void *)basicframe, (void *)obasicframe);
            error(debugStr);
          }
        }
        break;
      }
      case STK_FSB: {
        obasicframe = basicframe;
        basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

        if (0 != (3 & (UNSIGNED)basicframe)) {
          char debugStr[100];
          sprintf(debugStr,
                  "Frame ptr (%p) not to word bound "
                  "in gcscanstack() STK_FSB; old frame = %p.",
                  (void *)basicframe, (void *)obasicframe);
          error(debugStr);
        }

        break;
      }
      default: /* must be basic frame !! */
      {
        LispPTR bf_word;
        while (STK_BF != BF_FLAGS(bf_word = *((LispPTR *)basicframe))) {
          Stkref(PTR_BITS(bf_word));
          basicframe++;
        }
        basicframe++;
      }

        /* **** NOTE THIS CODE DOES NOT COMPILE CORRECTLY ON THE SUN 4
           {LispPTR bf_word;
           while(STK_BF != BF_FLAGS(
           bf_word = *((LispPTR *)basicframe++)))
           { Stkref(PTR_BITS(bf_word));
           }
           }
           **** */
    } /* switch */
  }   /* while(1) */
}